

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf,
              size_t size)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  byte *pbVar8;
  reference pvVar9;
  size_type sVar10;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *pvVar11;
  char *pcVar12;
  void *__dest;
  ostream *poVar13;
  string *in_RCX;
  long in_RDX;
  undefined1 *in_RSI;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *in_RDI;
  char *in_R8;
  long in_R9;
  stringstream ss_err;
  EXRAttribute attrib;
  bool ok;
  uchar tile_mode;
  uint y_size;
  uint x_size;
  size_t marker_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attr_type;
  string attr_name;
  size_t nattr;
  size_t orig_size;
  bool has_screen_window_width;
  bool has_screen_window_center;
  bool has_pixel_aspect_ratio;
  bool has_line_order;
  bool has_display_window;
  bool has_data_window;
  bool has_compression;
  bool has_channels;
  char *marker;
  size_type in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d7;
  value_type *in_stack_fffffffffffff9d8;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *in_stack_fffffffffffff9e0;
  pointer *in_stack_fffffffffffffa60;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *in_stack_fffffffffffffa68;
  size_t *in_stack_fffffffffffffa70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa78;
  string *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffa88;
  string local_4b0 [32];
  string local_490 [32];
  stringstream local_470 [16];
  ostream local_460 [376];
  char local_2e8 [255];
  undefined1 local_1e9;
  char local_1e8 [255];
  undefined1 local_e9;
  void *local_e8;
  undefined4 local_e0;
  byte local_d2;
  byte local_d1;
  uint local_d0;
  uint local_cc;
  int local_c8;
  long local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  string local_98 [32];
  string local_78 [32];
  ulong local_58;
  long local_50;
  byte local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  char *local_40;
  long local_38;
  string *local_28;
  long local_20;
  vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *local_10;
  int local_4;
  
  if (in_RSI != (undefined1 *)0x0) {
    *in_RSI = 0;
  }
  if (((*(int *)(in_RDX + 0x10) == 0) || (in_R9 == 0)) || (*in_R8 != '\0')) {
    local_41 = 0;
    local_42 = 0;
    local_43 = 0;
    local_44 = 0;
    local_45 = 0;
    local_46 = 0;
    local_47 = 0;
    local_48 = 0;
    *(undefined4 *)
     &in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = 0;
    *(undefined4 *)
     ((long)&in_RDI[2].
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_start + 4) = 0;
    *(undefined4 *)
     &in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)
     ((long)&in_RDI[2].
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined4 *)
     &in_RDI[2].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
    *(undefined4 *)
     ((long)&in_RDI[2].
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined4 *)
     &in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = 0;
    *(undefined4 *)
     ((long)&in_RDI[3].
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_start + 4) = 0;
    *(undefined4 *)
     &in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = 0;
    *(undefined4 *)
     ((long)&in_RDI[3].
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined4 *)
     &in_RDI[3].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0;
    *(undefined4 *)
     ((long)&in_RDI[3].
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 4) = 0xbf800000;
    *(undefined4 *)
     &in_RDI[4].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = 0xbf800000;
    *(undefined4 *)
     &in_RDI[4].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = 0xffffffff;
    *(undefined4 *)
     ((long)&in_RDI[4].
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_finish + 4) = 0xffffffff;
    *(undefined4 *)
     &in_RDI[4].super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = 0xffffffff;
    *(undefined4 *)
     ((long)&in_RDI[4].
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 4) = 0xffffffff;
    local_40 = in_R8;
    local_38 = in_R9;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::clear
              ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)0x1e0dec);
    local_50 = local_38;
    for (local_58 = 0; local_58 < 0x400; local_58 = local_58 + 1) {
      if (local_38 == 0) {
        if (local_28 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_28,"Insufficient data size for attributes.\n");
        }
        return -4;
      }
      if (*local_40 == '\0') {
        local_38 = local_38 + -1;
        break;
      }
      std::__cxx11::string::string(local_78);
      std::__cxx11::string::string(local_98);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e0ebf);
      bVar2 = ReadAttribute(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                            in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                            (char *)in_stack_fffffffffffffa68,(size_t)in_stack_fffffffffffffa60);
      if (bVar2) {
        local_40 = local_40 + local_b8;
        local_38 = local_38 - local_b8;
        if ((*(int *)(local_20 + 4) == 0) ||
           (iVar4 = std::__cxx11::string::compare((char *)local_78), iVar4 != 0)) {
          iVar4 = std::__cxx11::string::compare((char *)local_78);
          if (iVar4 == 0) {
            local_d2 = 0;
            pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_b0,0);
            if (*pbVar8 < 4) {
              local_d2 = 1;
            }
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_b0,0);
            if (*pvVar9 == '\x04') {
              local_d2 = 1;
            }
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&local_b0,0);
            if (*pvVar9 == 0x80) {
              if (local_28 != (string *)0x0) {
                std::__cxx11::string::operator=(local_28,"ZFP compression is not supported.");
              }
              local_4 = -8;
              local_c8 = 1;
            }
            else {
              if ((local_d2 & 1) != 0) {
                pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   (&local_b0,0);
                *(uint *)((long)&local_10[5].
                                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4) = (uint)*pbVar8;
                local_42 = 1;
                goto LAB_001e1ab2;
              }
              if (local_28 != (string *)0x0) {
                std::__cxx11::string::operator=(local_28,"Unknown compression type.");
              }
              local_4 = -8;
              local_c8 = 1;
            }
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)local_78);
            if (iVar4 == 0) {
              bVar2 = ReadChannelInfo(in_stack_fffffffffffffa68,
                                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      in_stack_fffffffffffffa60);
              if (bVar2) {
                sVar10 = std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::
                         size(local_10);
                if (sVar10 != 0) {
                  local_41 = 1;
                  goto LAB_001e1ab2;
                }
                if (local_28 != (string *)0x0) {
                  std::__cxx11::string::operator+=(local_28,"# of channels is zero.\n");
                }
                local_4 = -4;
                local_c8 = 1;
              }
              else {
                if (local_28 != (string *)0x0) {
                  std::__cxx11::string::operator+=(local_28,"Failed to parse channel info.\n");
                }
                local_4 = -4;
                local_c8 = 1;
              }
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)local_78);
              if (iVar4 == 0) {
                sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_b0)
                ;
                if (0xf < sVar10) {
                  pvVar11 = local_10 + 2;
                  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                                      in_stack_fffffffffffff9c8);
                  *(undefined4 *)
                   &(pvVar11->
                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>)
                    ._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pvVar9;
                  pvVar11 = local_10 + 2;
                  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                                      in_stack_fffffffffffff9c8);
                  *(undefined4 *)
                   ((long)&(pvVar11->
                           super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                           )._M_impl.super__Vector_impl_data._M_start + 4) = *(undefined4 *)pvVar9;
                  pvVar11 = local_10 + 2;
                  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                                      in_stack_fffffffffffff9c8);
                  *(undefined4 *)
                   &(pvVar11->
                    super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>)
                    ._M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)pvVar9;
                  pvVar11 = local_10 + 2;
                  pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                                      in_stack_fffffffffffff9c8);
                  *(undefined4 *)
                   ((long)&(pvVar11->
                           super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                           )._M_impl.super__Vector_impl_data._M_finish + 4) = *(undefined4 *)pvVar9;
                  swap4((int *)(local_10 + 2));
                  swap4((int *)((long)&local_10[2].
                                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 4));
                  swap4((int *)&local_10[2].
                                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish);
                  swap4((int *)((long)&local_10[2].
                                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4));
                  local_43 = 1;
                }
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)local_78);
                if (iVar4 == 0) {
                  sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     (&local_b0);
                  if (0xf < sVar10) {
                    pvVar11 = local_10 + 2;
                    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0
                                                ),in_stack_fffffffffffff9c8);
                    *(undefined4 *)
                     ((long)&(pvVar11->
                             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                             )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                         *(undefined4 *)pvVar9;
                    pvVar11 = local_10 + 3;
                    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0
                                                ),in_stack_fffffffffffff9c8);
                    *(undefined4 *)
                     &(pvVar11->
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)pvVar9;
                    pvVar11 = local_10 + 3;
                    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0
                                                ),in_stack_fffffffffffff9c8);
                    *(undefined4 *)
                     ((long)&(pvVar11->
                             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start + 4) = *(undefined4 *)pvVar9
                    ;
                    pvVar11 = local_10 + 3;
                    pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0
                                                ),in_stack_fffffffffffff9c8);
                    *(undefined4 *)
                     &(pvVar11->
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      )._M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)pvVar9;
                    swap4((int *)((long)&local_10[2].
                                         super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
                    swap4((int *)(local_10 + 3));
                    swap4((int *)((long)&local_10[3].
                                         super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4));
                    swap4((int *)&local_10[3].
                                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
                    local_44 = 1;
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)local_78);
                  if (iVar4 == 0) {
                    sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                       (&local_b0);
                    if (sVar10 != 0) {
                      pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                               operator[](&local_b0,0);
                      *(uint *)&local_10[2].
                                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage = (uint)*pbVar8;
                      local_45 = 1;
                    }
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)local_78);
                    if (iVar4 == 0) {
                      sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                         (&local_b0);
                      if (3 < sVar10) {
                        in_stack_fffffffffffffa80 = (string *)(local_10 + 4);
                        in_stack_fffffffffffffa88 =
                             (string *)
                             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0
                                                ),in_stack_fffffffffffff9c8);
                        *(undefined4 *)&(in_stack_fffffffffffffa80->_M_dataplus)._M_p =
                             *(undefined4 *)&(in_stack_fffffffffffffa88->_M_dataplus)._M_p;
                        swap4((float *)(local_10 + 4));
                        local_46 = 1;
                      }
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)local_78);
                      if (iVar4 == 0) {
                        sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                           (&local_b0);
                        if (7 < sVar10) {
                          in_stack_fffffffffffffa70 =
                               (size_t *)
                               ((long)&local_10[3].
                                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 4);
                          in_stack_fffffffffffffa78 =
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          CONCAT17(in_stack_fffffffffffff9d7,
                                                   in_stack_fffffffffffff9d0),
                                          in_stack_fffffffffffff9c8);
                          *(undefined4 *)in_stack_fffffffffffffa70 =
                               *(undefined4 *)
                                &(in_stack_fffffffffffffa78->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start;
                          in_stack_fffffffffffffa60 =
                               &local_10[3].
                                super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          in_stack_fffffffffffffa68 =
                               (vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)CONCAT17(in_stack_fffffffffffff9d7,
                                                         in_stack_fffffffffffff9d0),
                                             in_stack_fffffffffffff9c8);
                          *(undefined4 *)in_stack_fffffffffffffa60 =
                               *(undefined4 *)
                                &(in_stack_fffffffffffffa68->
                                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                          swap4((float *)((long)&local_10[3].
                                                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish + 4));
                          swap4((float *)&local_10[3].
                                          super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                          local_47 = 1;
                        }
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare((char *)local_78);
                        if (iVar4 == 0) {
                          sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                             (&local_b0);
                          if (3 < sVar10) {
                            pvVar11 = local_10 + 3;
                            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)CONCAT17(in_stack_fffffffffffff9d7,
                                                            in_stack_fffffffffffff9d0),
                                                in_stack_fffffffffffff9c8);
                            *(undefined4 *)
                             ((long)&(pvVar11->
                                     super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                                 *(undefined4 *)pvVar9;
                            swap4((float *)((long)&local_10[3].
                                                                                                      
                                                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           + 4));
                            local_48 = 1;
                          }
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare((char *)local_78);
                          if (iVar4 == 0) {
                            sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                     size(&local_b0);
                            if (3 < sVar10) {
                              pvVar11 = local_10 + 4;
                              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          CONCAT17(in_stack_fffffffffffff9d7,
                                                   in_stack_fffffffffffff9d0),
                                          in_stack_fffffffffffff9c8);
                              *(undefined4 *)
                               ((long)&(pvVar11->
                                       super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 4) =
                                   *(undefined4 *)pvVar9;
                              swap4((int *)((long)&local_10[4].
                                                                                                      
                                                  super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4));
                            }
                          }
                          else {
                            sVar10 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::
                                     size((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                          (local_10 + 1));
                            if (sVar10 < 0x80) {
                              pcVar12 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffff9d7,
                                                            in_stack_fffffffffffff9d0));
                              strncpy(local_2e8,pcVar12,0xff);
                              pcVar12 = std::__cxx11::
                                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffff9d7,
                                                            in_stack_fffffffffffff9d0));
                              strncpy(local_1e8,pcVar12,0xff);
                              local_1e9 = 0;
                              local_e9 = 0;
                              sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       size(&local_b0);
                              local_e0 = (undefined4)sVar10;
                              sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       size(&local_b0);
                              __dest = malloc(sVar10);
                              local_e8 = __dest;
                              pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          CONCAT17(in_stack_fffffffffffff9d7,
                                                   in_stack_fffffffffffff9d0),
                                          in_stack_fffffffffffff9c8);
                              sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       size(&local_b0);
                              memcpy(__dest,pvVar9,sVar10);
                              std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                        (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_001e1ab2:
              local_c8 = 0;
            }
          }
        }
        else {
          puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                                      in_stack_fffffffffffff9c8);
          local_cc = *puVar7;
          puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                                      in_stack_fffffffffffff9c8);
          local_d0 = *puVar7;
          pbVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_b0,8);
          local_d1 = *pbVar8;
          swap4(&local_cc);
          swap4(&local_d0);
          uVar6 = local_cc;
          uVar5 = std::numeric_limits<int>::max();
          uVar1 = local_d0;
          if ((uVar6 <= uVar5) && (uVar6 = std::numeric_limits<int>::max(), uVar1 <= uVar6)) {
            *(uint *)&local_10[4].
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish = local_cc;
            *(uint *)((long)&local_10[4].
                             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4) = local_d0;
            *(uint *)&local_10[4].
                      super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_d1 & 3;
            *(uint *)((long)&local_10[4].
                             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) =
                 (int)(uint)local_d1 >> 4 & 1;
            goto LAB_001e1ab2;
          }
          if (local_28 != (string *)0x0) {
            std::__cxx11::string::operator=(local_28,"Tile sizes were invalid.");
          }
          local_4 = -8;
          local_c8 = 1;
        }
      }
      else {
        if (local_28 != (string *)0x0) {
          std::__cxx11::string::operator+=(local_28,"Failed to read attribute.\n");
        }
        local_4 = -4;
        local_c8 = 1;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff9e0)
      ;
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_78);
      if (local_c8 != 0) {
        return local_4;
      }
    }
    std::__cxx11::stringstream::stringstream(local_470);
    if ((local_42 & 1) == 0) {
      poVar13 = std::operator<<(local_460,"\"compression\" attribute not found in the header.");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    if ((local_41 & 1) == 0) {
      poVar13 = std::operator<<(local_460,"\"channels\" attribute not found in the header.");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    if ((local_45 & 1) == 0) {
      poVar13 = std::operator<<(local_460,"\"lineOrder\" attribute not found in the header.");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    if ((local_44 & 1) == 0) {
      poVar13 = std::operator<<(local_460,"\"displayWindow\" attribute not found in the header.");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    if ((local_43 & 1) == 0) {
      poVar13 = std::operator<<(local_460,
                                "\"dataWindow\" attribute not found in the header or invalid.");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    if ((local_46 & 1) == 0) {
      poVar13 = std::operator<<(local_460,"\"pixelAspectRatio\" attribute not found in the header.")
      ;
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    if ((local_48 & 1) == 0) {
      poVar13 = std::operator<<(local_460,"\"screenWindowWidth\" attribute not found in the header."
                               );
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    if ((local_47 & 1) == 0) {
      poVar13 = std::operator<<(local_460,
                                "\"screenWindowCenter\" attribute not found in the header.");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::stringstream::str();
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e1d2b
                      );
    bVar3 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_490);
    if ((bVar3 & 1) == 0) {
      local_c8 = 0;
    }
    else {
      if (local_28 != (string *)0x0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_28,local_4b0);
        std::__cxx11::string::~string(local_4b0);
      }
      local_4 = -9;
      local_c8 = 1;
    }
    std::__cxx11::stringstream::~stringstream(local_470);
    if (local_c8 == 0) {
      *(int *)&local_10[5].
               super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
               _M_impl.super__Vector_impl_data._M_start = (int)local_50 - (int)local_38;
      local_4 = 0;
    }
  }
  else {
    if (in_RSI != (undefined1 *)0x0) {
      *in_RSI = 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf, size_t size) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (size > 0 && marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  // According to the spec, the header of every OpenEXR file must contain at
  // least the following attributes:
  //
  // channels chlist
  // compression compression
  // dataWindow box2i
  // displayWindow box2i
  // lineOrder lineOrder
  // pixelAspectRatio float
  // screenWindowCenter v2f
  // screenWindowWidth float
  bool has_channels = false;
  bool has_compression = false;
  bool has_data_window = false;
  bool has_display_window = false;
  bool has_line_order = false;
  bool has_pixel_aspect_ratio = false;
  bool has_screen_window_center = false;
  bool has_screen_window_width = false;

  info->data_window.min_x = 0;
  info->data_window.min_y = 0;
  info->data_window.max_x = 0;
  info->data_window.max_y = 0;
  info->line_order = 0;  // @fixme
  info->display_window.min_x = 0;
  info->display_window.min_y = 0;
  info->display_window.max_x = 0;
  info->display_window.max_y = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  size_t orig_size = size;
  for (size_t nattr = 0; nattr < TINYEXR_MAX_HEADER_ATTRIBUTES; nattr++) {
    if (0 == size) {
      if (err) {
        (*err) += "Insufficient data size for attributes.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    } else if (marker[0] == '\0') {
      size--;
      break;
    }

    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    size_t marker_size;
    if (!tinyexr::ReadAttribute(&attr_name, &attr_type, &data, &marker_size,
                                marker, size)) {
      if (err) {
        (*err) += "Failed to read attribute.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    marker += marker_size;
    size -= marker_size;

    if (version->tiled && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      assert(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      if (x_size > static_cast<unsigned int>(std::numeric_limits<int>::max()) ||
          y_size > static_cast<unsigned int>(std::numeric_limits<int>::max())) {
        if (err) {
          (*err) = "Tile sizes were invalid.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;

    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);
      has_compression = true;

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      if (!ReadChannelInfo(info->channels, data)) {
        if (err) {
          (*err) += "Failed to parse channel info.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      if (info->channels.size() < 1) {
        if (err) {
          (*err) += "# of channels is zero.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      has_channels = true;

    } else if (attr_name.compare("dataWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->data_window.min_x, &data.at(0), sizeof(int));
        memcpy(&info->data_window.min_y, &data.at(4), sizeof(int));
        memcpy(&info->data_window.max_x, &data.at(8), sizeof(int));
        memcpy(&info->data_window.max_y, &data.at(12), sizeof(int));
        tinyexr::swap4(&info->data_window.min_x);
        tinyexr::swap4(&info->data_window.min_y);
        tinyexr::swap4(&info->data_window.max_x);
        tinyexr::swap4(&info->data_window.max_y);
        has_data_window = true;
      }
    } else if (attr_name.compare("displayWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->display_window.min_x, &data.at(0), sizeof(int));
        memcpy(&info->display_window.min_y, &data.at(4), sizeof(int));
        memcpy(&info->display_window.max_x, &data.at(8), sizeof(int));
        memcpy(&info->display_window.max_y, &data.at(12), sizeof(int));
        tinyexr::swap4(&info->display_window.min_x);
        tinyexr::swap4(&info->display_window.min_y);
        tinyexr::swap4(&info->display_window.max_x);
        tinyexr::swap4(&info->display_window.max_y);

        has_display_window = true;
      }
    } else if (attr_name.compare("lineOrder") == 0) {
      if (data.size() >= 1) {
        info->line_order = static_cast<int>(data[0]);
        has_line_order = true;
      }
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
        tinyexr::swap4(&info->pixel_aspect_ratio);
        has_pixel_aspect_ratio = true;
      }
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      if (data.size() >= 8) {
        memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
        memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
        tinyexr::swap4(&info->screen_window_center[0]);
        tinyexr::swap4(&info->screen_window_center[1]);
        has_screen_window_center = true;
      }
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
        tinyexr::swap4(&info->screen_window_width);

        has_screen_window_width = true;
      }
    } else if (attr_name.compare("chunkCount") == 0) {
      if (data.size() >= sizeof(int)) {
        memcpy(&info->chunk_count, &data.at(0), sizeof(int));
        tinyexr::swap4(&info->chunk_count);
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_CUSTOM_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
        EXRAttribute attrib;
#ifdef _MSC_VER
        strncpy_s(attrib.name, attr_name.c_str(), 255);
        strncpy_s(attrib.type, attr_type.c_str(), 255);
#else
        strncpy(attrib.name, attr_name.c_str(), 255);
        strncpy(attrib.type, attr_type.c_str(), 255);
#endif
        attrib.name[255] = '\0';
        attrib.type[255] = '\0';
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }
  }

  // Check if required attributes exist
  {
    std::stringstream ss_err;

    if (!has_compression) {
      ss_err << "\"compression\" attribute not found in the header."
             << std::endl;
    }

    if (!has_channels) {
      ss_err << "\"channels\" attribute not found in the header." << std::endl;
    }

    if (!has_line_order) {
      ss_err << "\"lineOrder\" attribute not found in the header." << std::endl;
    }

    if (!has_display_window) {
      ss_err << "\"displayWindow\" attribute not found in the header."
             << std::endl;
    }

    if (!has_data_window) {
      ss_err << "\"dataWindow\" attribute not found in the header or invalid."
             << std::endl;
    }

    if (!has_pixel_aspect_ratio) {
      ss_err << "\"pixelAspectRatio\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_width) {
      ss_err << "\"screenWindowWidth\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_center) {
      ss_err << "\"screenWindowCenter\" attribute not found in the header."
             << std::endl;
    }

    if (!(ss_err.str().empty())) {
      if (err) {
        (*err) += ss_err.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  info->header_len = static_cast<unsigned int>(orig_size - size);

  return TINYEXR_SUCCESS;
}